

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O0

string_t duckdb::VectorStringCastOperator<duckdb::VarIntCastToVarchar>::
         Operation<duckdb::string_t,duckdb::string_t>
                   (string_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  anon_union_16_2_67f50693_for_value aVar1;
  Vector *unaff_retaddr;
  string_t in_stack_00000008;
  Vector *result;
  
  aVar1.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       VarIntCastToVarchar::Operation<duckdb::string_t>(in_stack_00000008,unaff_retaddr);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto result = reinterpret_cast<Vector *>(dataptr);
		return OP::template Operation<INPUT_TYPE>(input, *result);
	}